

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_arkstep.c
# Opt level: O3

int arkStep_ComputeSolutions(ARKodeMem ark_mem,realtype *dsmPtr)

{
  int iVar1;
  int iVar2;
  void *pvVar3;
  N_Vector z;
  N_Vector z_00;
  realtype *c;
  N_Vector *X;
  int iVar4;
  int iVar5;
  long lVar6;
  realtype rVar7;
  
  pvVar3 = ark_mem->step_mem;
  if (pvVar3 == (void *)0x0) {
    iVar4 = -0x15;
    arkProcessError((ARKodeMem)0x0,-0x15,"ARKode::ARKStep","arkStep_ComputeSolutions",
                    "Time step module memory is NULL.");
  }
  else {
    z = ark_mem->ycur;
    z_00 = ark_mem->tempv1;
    c = *(realtype **)((long)pvVar3 + 0x198);
    X = *(N_Vector **)((long)pvVar3 + 0x1a0);
    *dsmPtr = 0.0;
    *c = 1.0;
    *X = ark_mem->yn;
    iVar4 = *(int *)((long)pvVar3 + 0x5c);
    if ((long)iVar4 < 1) {
      iVar5 = 1;
    }
    else {
      iVar1 = *(int *)((long)pvVar3 + 0x18);
      iVar2 = *(int *)((long)pvVar3 + 0x1c);
      iVar5 = 1;
      lVar6 = 0;
      do {
        if (iVar1 != 0) {
          c[iVar5] = ark_mem->h *
                     *(double *)(*(long *)(*(long *)((long)pvVar3 + 0x60) + 0x20) + lVar6 * 8);
          X[iVar5] = *(N_Vector *)(*(long *)((long)pvVar3 + 0x28) + lVar6 * 8);
          iVar5 = iVar5 + 1;
        }
        if (iVar2 != 0) {
          c[iVar5] = ark_mem->h *
                     *(double *)(*(long *)(*(long *)((long)pvVar3 + 0x68) + 0x20) + lVar6 * 8);
          X[iVar5] = *(N_Vector *)(*(long *)((long)pvVar3 + 0x30) + lVar6 * 8);
          iVar5 = iVar5 + 1;
        }
        lVar6 = lVar6 + 1;
      } while (iVar4 != lVar6);
    }
    iVar5 = N_VLinearCombination(iVar5,c,X,z);
    iVar4 = -0x1c;
    if ((iVar5 == 0) && (iVar4 = 0, ark_mem->fixedstep == 0)) {
      iVar4 = *(int *)((long)pvVar3 + 0x5c);
      if ((long)iVar4 < 1) {
        iVar5 = 0;
      }
      else {
        iVar1 = *(int *)((long)pvVar3 + 0x18);
        iVar2 = *(int *)((long)pvVar3 + 0x1c);
        lVar6 = 0;
        iVar5 = 0;
        do {
          if (iVar1 != 0) {
            c[iVar5] = (*(double *)(*(long *)(*(long *)((long)pvVar3 + 0x60) + 0x20) + lVar6 * 8) -
                       *(double *)(*(long *)(*(long *)((long)pvVar3 + 0x60) + 0x28) + lVar6 * 8)) *
                       ark_mem->h;
            X[iVar5] = *(N_Vector *)(*(long *)((long)pvVar3 + 0x28) + lVar6 * 8);
            iVar5 = iVar5 + 1;
          }
          if (iVar2 != 0) {
            c[iVar5] = (*(double *)(*(long *)(*(long *)((long)pvVar3 + 0x68) + 0x20) + lVar6 * 8) -
                       *(double *)(*(long *)(*(long *)((long)pvVar3 + 0x68) + 0x28) + lVar6 * 8)) *
                       ark_mem->h;
            X[iVar5] = *(N_Vector *)(*(long *)((long)pvVar3 + 0x30) + lVar6 * 8);
            iVar5 = iVar5 + 1;
          }
          lVar6 = lVar6 + 1;
        } while (iVar4 != lVar6);
      }
      iVar5 = N_VLinearCombination(iVar5,c,X,z_00);
      iVar4 = -0x1c;
      if (iVar5 == 0) {
        rVar7 = N_VWrmsNorm(z_00,ark_mem->ewt);
        *dsmPtr = rVar7;
        iVar4 = 0;
      }
    }
  }
  return iVar4;
}

Assistant:

int arkStep_ComputeSolutions(ARKodeMem ark_mem, realtype *dsmPtr)
{
  /* local data */
  int retval, j, nvec;
  N_Vector y, yerr;
  realtype* cvals;
  N_Vector* Xvecs;
  ARKodeARKStepMem step_mem;

  /* access ARKodeARKStepMem structure */
  if (ark_mem->step_mem==NULL) {
    arkProcessError(NULL, ARK_MEM_NULL, "ARKode::ARKStep",
                    "arkStep_ComputeSolutions", MSG_ARKSTEP_NO_MEM);
    return(ARK_MEM_NULL);
  }
  step_mem = (ARKodeARKStepMem) ark_mem->step_mem;

  /* set N_Vector shortcuts, and shortcut to time at end of step */
  y    = ark_mem->ycur;
  yerr = ark_mem->tempv1;

  /* local shortcuts for fused vector operations */
  cvals = step_mem->cvals;
  Xvecs = step_mem->Xvecs;

  /* initialize output */
  *dsmPtr = ZERO;

  /* Compute time step solution */
  /*   set arrays for fused vector operation */
  cvals[0] = ONE;
  Xvecs[0] = ark_mem->yn;
  nvec = 1;
  for (j=0; j<step_mem->stages; j++) {
    if (step_mem->explicit) {      /* Explicit pieces */
      cvals[nvec] = ark_mem->h * step_mem->Be->b[j];
      Xvecs[nvec] = step_mem->Fe[j];
      nvec += 1;
    }
    if (step_mem->implicit) {      /* Implicit pieces */
      cvals[nvec] = ark_mem->h * step_mem->Bi->b[j];
      Xvecs[nvec] = step_mem->Fi[j];
      nvec += 1;
    }
  }

  /*   call fused vector operation to do the work */
  retval = N_VLinearCombination(nvec, cvals, Xvecs, y);
  if (retval != 0) return(ARK_VECTOROP_ERR);

  /* Compute yerr (if step adaptivity enabled) */
  if (!ark_mem->fixedstep) {

    /* set arrays for fused vector operation */
    nvec = 0;
    for (j=0; j<step_mem->stages; j++) {
      if (step_mem->explicit) {        /* Explicit pieces */
        cvals[nvec] = ark_mem->h * (step_mem->Be->b[j] - step_mem->Be->d[j]);
        Xvecs[nvec] = step_mem->Fe[j];
        nvec += 1;
      }
      if (step_mem->implicit) {        /* Implicit pieces */
        cvals[nvec] = ark_mem->h * (step_mem->Bi->b[j] - step_mem->Bi->d[j]);
        Xvecs[nvec] = step_mem->Fi[j];
        nvec += 1;
      }
    }

    /* call fused vector operation to do the work */
    retval = N_VLinearCombination(nvec, cvals, Xvecs, yerr);
    if (retval != 0) return(ARK_VECTOROP_ERR);

    /* fill error norm */
    *dsmPtr = N_VWrmsNorm(yerr, ark_mem->ewt);
  }

  return(ARK_SUCCESS);
}